

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Person.cpp
# Opt level: O3

void __thiscall mbc::Val::Person::update_ID_(Person *this)

{
  Str *this_00;
  string local_38;
  
  this_00 = this->ID_;
  hash__abi_cxx11_(&local_38,this);
  _ValAtom::set(&this_00->super__ValAtom,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Person::update_ID_() {
    ID_ -> set(hash_());
}